

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O0

Position * __thiscall iDynTree::Axis::getPointOnAxisClosestToGivenPoint(Axis *this,Position *point)

{
  Axis *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  Vector3d projection;
  Vector3d axisOrigin_p_point;
  Vector3d direction;
  Position *closestPointOnAxis;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  VectorFixSize<3U> *in_stack_fffffffffffffee8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffef8;
  double *in_stack_ffffffffffffff10;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff18;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff20;
  
  this_00 = in_RDI;
  getDirection(in_RSI);
  toEigen<3U>(in_stack_fffffffffffffee8);
  Eigen::
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  normalized(in_stack_ffffffffffffff20);
  toEigen<3U>(in_stack_fffffffffffffee8);
  getOrigin(in_RSI);
  toEigen<3U>(in_stack_fffffffffffffee8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  operator-(in_stack_fffffffffffffef8,
            (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)in_stack_fffffffffffffef0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
            (this_00,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_RSI);
  Position::Position((Position *)0x627950);
  getOrigin(in_RSI);
  toEigen<3U>(in_stack_fffffffffffffee8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  toEigen<3U>(in_stack_fffffffffffffee8);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_RSI);
  return (Position *)in_RDI;
}

Assistant:

iDynTree::Position Axis::getPointOnAxisClosestToGivenPoint(const iDynTree::Position& point) const
    {
            Eigen::Vector3d direction = iDynTree::toEigen(this->getDirection()).normalized();

            // Vector from the offset point of the to the given point
            Eigen::Vector3d axisOrigin_p_point = iDynTree::toEigen(point) - iDynTree::toEigen(this->getOrigin());

            // Project the axisOrigin_p_point onto the axis direction
            Eigen::Vector3d projection = direction * axisOrigin_p_point.dot(direction);

            // Calculate the closest point on the axis to the given point
            iDynTree::Position closestPointOnAxis;
            iDynTree::toEigen(closestPointOnAxis) = iDynTree::toEigen(this->getOrigin()) + projection;

            return closestPointOnAxis;
    }